

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

bool server::setmaster(clientinfo *ci,bool val,char *pass,char *authname,char *authdesc,int authpriv
                      ,bool force,bool trial)

{
  bool bVar1;
  int iVar2;
  clientinfo **ppcVar3;
  char *pcVar4;
  ENetPacket *packet;
  char *pcVar5;
  int local_1d0;
  bool local_1c9;
  int local_1b8;
  int i_2;
  undefined1 local_1a8 [8];
  packetbuf p;
  stringformatter local_178;
  stringformatter local_170;
  char local_168 [8];
  string msg;
  int local_5c;
  int i_1;
  bool hasmaster;
  int i;
  int wantpriv;
  bool haspass;
  char *name;
  bool trial_local;
  bool force_local;
  int authpriv_local;
  char *authdesc_local;
  char *authname_local;
  char *pass_local;
  bool val_local;
  clientinfo *ci_local;
  
  if ((authname != (char *)0x0) && (!val)) {
    return false;
  }
  if (val) {
    local_1c9 = false;
    if (*adminpass != '\0') {
      local_1c9 = checkpassword(ci,adminpass,pass);
    }
    if (((ci->local & 1U) != 0) || (local_1d0 = authpriv, local_1c9 != false)) {
      local_1d0 = 3;
    }
    if (local_1d0 <= ci->privilege) {
      return true;
    }
    if ((local_1d0 < 2) && (!force)) {
      if ((ci->state).state == 5) {
        sendf(ci->clientnum,1,"ris",0x23,"Spectators may not claim master.");
        return false;
      }
      if (enablemultiplemasters == 0) {
        for (i_1 = 0; iVar2 = vector<server::clientinfo_*>::length
                                        ((vector<server::clientinfo_*> *)clients), i_1 < iVar2;
            i_1 = i_1 + 1) {
          ppcVar3 = vector<server::clientinfo_*>::operator[]
                              ((vector<server::clientinfo_*> *)clients,i_1);
          if ((ci != *ppcVar3) &&
             (ppcVar3 = vector<server::clientinfo_*>::operator[]
                                  ((vector<server::clientinfo_*> *)clients,i_1),
             (*ppcVar3)->privilege != 0)) {
            sendf(ci->clientnum,1,"ris",0x23,"\f3Error: Someone already has privileges");
            return false;
          }
        }
      }
      if ((((authname == (char *)0x0) && ((mastermask & 0x1000) == 0)) && (ci->privilege == 0)) &&
         ((ci->local & 1U) == 0)) {
        sendf(ci->clientnum,1,"ris",0x23,
              "This server requires you to use the \"/auth\" command to claim master.");
        return false;
      }
    }
    if (trial) {
      return true;
    }
    ci->privilege = local_1d0;
    _wantpriv = privname(ci->privilege);
  }
  else {
    if (ci->privilege == 0) {
      return false;
    }
    if (trial) {
      return true;
    }
    _wantpriv = privname(ci->privilege);
    revokemaster(ci);
  }
  bVar1 = false;
  for (local_5c = 0;
      iVar2 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients),
      local_5c < iVar2; local_5c = local_5c + 1) {
    ppcVar3 = vector<server::clientinfo_*>::operator[]
                        ((vector<server::clientinfo_*> *)clients,local_5c);
    if ((((*ppcVar3)->local & 1U) != 0) ||
       (ppcVar3 = vector<server::clientinfo_*>::operator[]
                            ((vector<server::clientinfo_*> *)clients,local_5c),
       0 < (*ppcVar3)->privilege)) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    mastermode = 0;
    vector<unsigned_int>::shrink((vector<unsigned_int> *)allowedips,0);
  }
  if ((val) && (authname != (char *)0x0)) {
    if ((authdesc == (char *)0x0) || (*authdesc == '\0')) {
      stringformatter::stringformatter(&local_178,local_168);
      pcVar4 = colorname(ci);
      stringformatter::operator()
                (&local_178,"\f0%s \f7claimed %s \f7as \'\fs\f5%s\fr\'",pcVar4,_wantpriv,authname);
    }
    else {
      stringformatter::stringformatter(&local_170,local_168);
      pcVar4 = colorname(ci);
      stringformatter::operator()
                (&local_170,"\f0%s \f7claimed \f6%s \f7as \'\fs\f5%s\fr\' [\fs\f0%s\fr]",pcVar4,
                 _wantpriv,authname,authdesc);
    }
  }
  else {
    stringformatter::stringformatter((stringformatter *)&p.growth,local_168);
    pcVar4 = colorname(ci);
    pcVar5 = "relinquished";
    if (val) {
      pcVar5 = "claimed";
    }
    stringformatter::operator()
              ((stringformatter *)&p.growth,"\f0%s \f7%s %s",pcVar4,pcVar5,_wantpriv);
  }
  packetbuf::packetbuf((packetbuf *)local_1a8,5000,1);
  putint((packetbuf *)local_1a8,0x23);
  sendstring(local_168,(packetbuf *)local_1a8);
  putint((packetbuf *)local_1a8,0x3d);
  putint((packetbuf *)local_1a8,mastermode);
  for (local_1b8 = 0;
      iVar2 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients),
      local_1b8 < iVar2; local_1b8 = local_1b8 + 1) {
    ppcVar3 = vector<server::clientinfo_*>::operator[]
                        ((vector<server::clientinfo_*> *)clients,local_1b8);
    if (0 < (*ppcVar3)->privilege) {
      ppcVar3 = vector<server::clientinfo_*>::operator[]
                          ((vector<server::clientinfo_*> *)clients,local_1b8);
      putint((packetbuf *)local_1a8,(*ppcVar3)->clientnum);
      ppcVar3 = vector<server::clientinfo_*>::operator[]
                          ((vector<server::clientinfo_*> *)clients,local_1b8);
      putint((packetbuf *)local_1a8,(*ppcVar3)->privilege);
    }
  }
  putint((packetbuf *)local_1a8,-1);
  packet = packetbuf::finalize((packetbuf *)local_1a8);
  sendpacket(-1,1,packet,-1);
  checkpausegame();
  packetbuf::~packetbuf((packetbuf *)local_1a8);
  return true;
}

Assistant:

bool setmaster(clientinfo *ci, bool val, const char *pass = "", const char *authname = NULL, const char *authdesc = NULL, int authpriv = PRIV_MASTER, bool force = false, bool trial = false)
    {
        if(authname && !val) return false;
        const char *name = "";
        if(val)
        {
            bool haspass = adminpass[0] && checkpassword(ci, adminpass, pass);
            int wantpriv = ci->local || haspass ? PRIV_ADMIN : authpriv;
            if(wantpriv <= ci->privilege) return true;
            else if(wantpriv <= PRIV_MASTER && !force)
            {
                if(ci->state.state==CS_SPECTATOR)
                {
                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "Spectators may not claim master.");
                    return false;
                }
                if(!enablemultiplemasters) {
                    loopv(clients) if(ci!=clients[i] && clients[i]->privilege)
                    {
                        sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Error: Someone already has privileges");
                        return false;
                    }
                }
                if(!authname && !(mastermask&MM_AUTOAPPROVE) && !ci->privilege && !ci->local)
                {
                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "This server requires you to use the \"/auth\" command to claim master.");
                    return false;
                }
            }
            if(trial) return true;
            ci->privilege = wantpriv;
            name = privname(ci->privilege);
        }
        else
        {
            if(!ci->privilege) return false;
            if(trial) return true;
            name = privname(ci->privilege);
            revokemaster(ci);
        }
        bool hasmaster = false;
        loopv(clients) if(clients[i]->local || clients[i]->privilege >= PRIV_MASTER) hasmaster = true;
        if(!hasmaster)
        {
            mastermode = MM_OPEN;
            allowedips.shrink(0);
        }
        string msg;
        if(val && authname)
        {
            if(authdesc && authdesc[0]) formatstring(msg)("\f0%s \f7claimed \f6%s \f7as '\fs\f5%s\fr' [\fs\f0%s\fr]", colorname(ci), name, authname, authdesc);
            else formatstring(msg)("\f0%s \f7claimed %s \f7as '\fs\f5%s\fr'", colorname(ci), name, authname);
        }
        else formatstring(msg)("\f0%s \f7%s %s", colorname(ci), val ? "claimed" : "relinquished", name);
        packetbuf p(MAXTRANS, ENET_PACKET_FLAG_RELIABLE);
        putint(p, N_SERVMSG);
        sendstring(msg, p);
        putint(p, N_CURRENTMASTER);
        putint(p, mastermode);
        loopv(clients) if(clients[i]->privilege >= PRIV_MASTER)
        {
            putint(p, clients[i]->clientnum);
            putint(p, clients[i]->privilege);
        }
        putint(p, -1);
        sendpacket(-1, 1, p.finalize());
        checkpausegame();
        return true;
    }